

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_RipperBlood(AActor *mo,AActor *bleeder)

{
  byte *pbVar1;
  uint kind;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar9;
  DVector3 pos;
  DVector2 v;
  DVector3 local_60;
  DAngle local_48;
  _func_int **local_40;
  PClass *pPStack_38;
  
  if ((bleeder->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(bleeder->super_DThinker).super_DObject._vptr_DObject)(bleeder);
    (bleeder->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  kind = *(uint *)&(bleeder->super_DThinker).super_DObject.Class[1].super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.VisitNext;
  type = AActor::GetBloodType(bleeder,0);
  uVar3 = FRandom::GenRand32(&pr_ripperblood);
  uVar4 = FRandom::GenRand32(&pr_ripperblood);
  uVar5 = FRandom::GenRand32(&pr_ripperblood);
  uVar6 = FRandom::GenRand32(&pr_ripperblood);
  uVar7 = FRandom::GenRand32(&pr_ripperblood);
  uVar8 = FRandom::GenRand32(&pr_ripperblood);
  P_GetOffsetPosition((mo->__Pos).X,(mo->__Pos).Y,
                      (double)(int)((uVar3 & 0xff) - (uVar4 & 0xff)) * 0.0625,
                      (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.0625);
  local_60.Z = (double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.0625 + (mo->__Pos).Z;
  local_60.X = (double)local_40;
  local_60.Y = (double)pPStack_38;
  uVar3 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar3 = cl_bloodtype.Value & (*(int *)((type->super_PClass).Defaults + 0x198) << 4) >> 0x1f;
    pAVar9 = AActor::StaticSpawn(type,&local_60,NO_REPLACE,false);
    if (((pAVar9->flags5).Value & 0x800000) != 0) {
      (pAVar9->target).field_0.p = bleeder;
    }
    if (gameinfo.gametype == GAME_Heretic) {
      pbVar1 = (byte *)((long)&(pAVar9->flags).Value + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    (pAVar9->Vel).X = (mo->Vel).X * 0.5;
    (pAVar9->Vel).Y = (mo->Vel).Y * 0.5;
    uVar4 = FRandom::GenRand32(&pr_ripperblood);
    pAVar9->tics = pAVar9->tics + (uVar4 & 3);
    if ((kind != 0) && (((pAVar9->flags2).Value & 0x10000) == 0)) {
      pAVar9->Translation = kind >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar3) {
      pbVar1 = (byte *)((long)&(pAVar9->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  if (0 < (int)uVar3) {
    AActor::AngleTo((AActor *)&stack0xffffffffffffffc0,bleeder,SUB81(mo,0));
    local_48.Degrees = (double)local_40 + 180.0;
    P_DrawSplash2(0x1c,&local_60,&local_48,0,kind);
  }
  return;
}

Assistant:

void P_RipperBlood (AActor *mo, AActor *bleeder)
{
	PalEntry bloodcolor = bleeder->GetBloodColor();
	PClassActor *bloodcls = bleeder->GetBloodType();

	double xo = pr_ripperblood.Random2() / 16.;
	double yo = pr_ripperblood.Random2() / 16.;
	double zo = pr_ripperblood.Random2() / 16.;
	DVector3 pos = mo->Vec3Offset(xo, yo, zo);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *th;
		th = Spawn (bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = bleeder;
		if (gameinfo.gametype == GAME_Heretic)
			th->flags |= MF_NOGRAVITY;
		th->Vel.X = mo->Vel.X / 2;
		th->Vel.Y = mo->Vel.Y / 2;
		th->tics += pr_ripperblood () & 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(28, pos, bleeder->AngleTo(mo) + 180., 0, bloodcolor);
	}
}